

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O2

void __thiscall
Kernel::InferenceStore::TPTPProofPrinter::printSplitting(TPTPProofPrinter *this,Unit *us)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  InferenceRule rule;
  undefined4 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar3;
  UnitIterator parents;
  string inferenceStr;
  undefined1 local_100 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  rule = (us->_inference).field_0x1;
  Unit::getParents((Unit *)local_100);
  tptpRuleName_abi_cxx11_(&local_b0,this,rule);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_100 + 0x10),"inference(",&local_b0);
  std::operator+(&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_100 + 0x10),",[],[");
  std::__cxx11::string::~string((string *)(local_100 + 0x10));
  std::__cxx11::string::~string((string *)&local_b0);
  (*(*(_func_int ***)local_100._0_8_)[2])();
  iVar2 = (*(*(_func_int ***)local_100._0_8_)[3])();
  tptpUnitId_abi_cxx11_((string *)(local_100 + 0x10),this,(Unit *)CONCAT44(extraout_var,iVar2));
  local_100._12_4_ = (uint)rule;
  std::__cxx11::string::append((string *)&local_d0);
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_100 + 0x10);
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  while( true ) {
    iVar2 = (*(*(_func_int ***)local_100._0_8_)[2])();
    if ((char)iVar2 == '\0') break;
    iVar2 = (*(*(_func_int ***)local_100._0_8_)[3])();
    tptpDefId_abi_cxx11_(&local_b0,this,(Unit *)CONCAT44(extraout_var_00,iVar2));
    std::operator+(__return_storage_ptr__,",",&local_b0);
    std::__cxx11::string::append((string *)&local_d0);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::append((char *)&local_d0);
  uVar1 = local_100._12_4_;
  poVar3 = (this->super_ProofPrinter).out;
  tptpUnitId_abi_cxx11_(&local_50,this,us);
  getFormulaString_abi_cxx11_(&local_70,this,us);
  std::__cxx11::string::string((string *)&local_90,(string *)&local_d0);
  getFofString((string *)(local_100 + 0x10),this,&local_50,&local_70,&local_90,(InferenceRule)uVar1,
               AXIOM);
  poVar3 = std::operator<<(poVar3,(string *)(local_100 + 0x10));
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)(local_100 + 0x10));
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_d0);
  Lib::VirtualIterator<Kernel::Unit_*>::~VirtualIterator
            ((VirtualIterator<Kernel::Unit_*> *)local_100);
  return;
}

Assistant:

void printSplitting(Unit* us)
  {
    ASS(us->isClause());

    InferenceRule rule = us->inference().rule();
    UnitIterator parents= us->getParents();
    ASS(rule==InferenceRule::GENERAL_SPLITTING);

    std::string inferenceStr="inference("+tptpRuleName(rule)+",[],[";

    //here we rely on the fact that the base premise is always put as the first premise in
    //GeneralSplitting::apply

    ALWAYS(parents.hasNext());
    Unit* base=parents.next();
    inferenceStr+=tptpUnitId(base);

    ASS(parents.hasNext()); //we always split off at least one component
    while(parents.hasNext()) {
      Unit* comp=parents.next();
      ASS(_is->_splittingNameLiterals.find(comp));
      inferenceStr+=","+tptpDefId(comp);
    }
    inferenceStr+="])";

    out<<getFofString(tptpUnitId(us), getFormulaString(us), inferenceStr, rule)<<endl;
  }